

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O3

Token __thiscall
slang::parsing::NumberParser::finishValue
          (NumberParser *this,Token firstToken,bool singleToken,bool isNegated)

{
  SVInt *this_00;
  SourceLocation location;
  BumpAllocator *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  undefined8 uVar3;
  bitwidth_t bits;
  __extent_storage<18446744073709551615UL> in_R9;
  Info *pIVar4;
  bitwidth_t bVar5;
  Token TVar6;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  SVInt result;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_90;
  uint local_88;
  undefined1 local_84;
  byte bStack_83;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_80;
  uint local_78;
  undefined1 uStack_74;
  byte bStack_73;
  undefined2 uStack_72;
  string_view local_70;
  Token local_60 [2];
  pointer local_40;
  size_type sStack_38;
  
  local_60[0].info = firstToken.info;
  local_60[0]._0_8_ = firstToken._0_8_;
  if (this->valid == false) {
    pBVar1 = this->alloc;
    sVar7 = Token::trivia(local_60);
    if (singleToken) {
      local_70 = Token::rawText(local_60);
    }
    else {
      iVar2 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar7._M_extent._M_extent_value._M_extent_value);
      local_70._M_str._4_4_ = extraout_var;
      local_70._M_str._0_4_ = iVar2;
      local_70._M_len = extraout_RDX;
    }
    location = this->firstLocation;
    bStack_83 = 0;
    local_90.val._0_6_ = 0;
    local_90.val._6_2_ = 0;
    local_84 = 1;
    local_88 = 1;
    SVInt::clearUnusedBits((SVInt *)&local_90);
    Token::Token((Token *)&local_80,pBVar1,IntegerLiteral,sVar7,local_70,location,(SVInt *)&local_90
                );
    if (((0x40 < local_88) || ((bStack_83 & 1) != 0)) &&
       ((void *)CONCAT26(local_90.val._6_2_,local_90.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(local_90.val._6_2_,local_90.val._0_6_));
    }
    uVar3 = CONCAT71(local_80.val._1_7_,local_80.val._0_1_);
    pIVar4 = (Info *)CONCAT26(uStack_72,CONCAT15(bStack_73,CONCAT14(uStack_74,local_78)));
    goto LAB_00877a71;
  }
  if ((this->literalBase == 2) && (this->hasUnknown == false)) {
    this_00 = &this->decimalValue;
    bVar5 = (this->decimalValue).super_SVIntStorage.bitWidth;
    bits = (bitwidth_t)this_00;
    if (this->signFlag == true) {
      bVar5 = bVar5 + 1;
      SVInt::resize((SVInt *)&local_80,bits);
      SVInt::operator=(this_00,(SVInt *)&local_80);
      if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
         ((void *)CONCAT71(local_80.val._1_7_,local_80.val._0_1_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_80.val._1_7_,local_80.val._0_1_));
      }
    }
    local_90.val._0_6_ = 0;
    local_90.val._6_2_ = 0;
    local_88 = 1;
    local_84 = 0;
    bStack_83 = 0;
    if (this->sizeBits == 0) {
      if (0x1f < bVar5) goto LAB_0087787a;
      SVInt::resize((SVInt *)&local_80,bits);
      SVInt::operator=((SVInt *)&local_90,(SVInt *)&local_80);
      if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
         ((void *)CONCAT71(local_80.val._1_7_,local_80.val._0_1_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_80.val._1_7_,local_80.val._0_1_));
      }
    }
    else if (bVar5 == this->sizeBits) {
LAB_0087787a:
      SVInt::operator=((SVInt *)&local_90,this_00);
    }
    else {
      SVInt::resize((SVInt *)&local_80,bits);
      SVInt::operator=((SVInt *)&local_90,(SVInt *)&local_80);
      if (((0x40 < local_78) || ((bStack_73 & 1) != 0)) &&
         ((void *)CONCAT71(local_80.val._1_7_,local_80.val._0_1_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_80.val._1_7_,local_80.val._0_1_));
      }
      if (this->sizeBits < bVar5) {
        finishValue::anon_class_16_2_3c4fafbd::operator()
                  ((anon_class_16_2_3c4fafbd *)(ulong)isNegated,(bitwidth_t)this,
                   (SVInt *)(ulong)bVar5);
      }
    }
    local_84 = this->signFlag;
    pBVar1 = this->alloc;
    sVar7 = Token::trivia(local_60);
    if (singleToken) {
      local_70 = Token::rawText(local_60);
    }
    else {
      iVar2 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar7._M_extent._M_extent_value._M_extent_value);
      local_70._M_str._4_4_ = extraout_var_00;
      local_70._M_str._0_4_ = iVar2;
      local_70._M_len = extraout_RDX_00;
    }
    Token::Token((Token *)&local_80,pBVar1,IntegerLiteral,sVar7,local_70,this->firstLocation,
                 (SVInt *)&local_90);
  }
  else {
    if ((this->digits).super_SmallVectorBase<slang::logic_t>.len != 0) {
      TVar6 = (Token)(*(code *)(&DAT_00a45100 +
                               *(int *)(&DAT_00a45100 + (ulong)(uint)this->literalBase * 4)))();
      return TVar6;
    }
    local_80.val._0_1_ = 0;
    SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
              (&(this->digits).super_SmallVectorBase<slang::logic_t>,(logic_t *)&local_80);
    bVar5 = 0x20;
    if (this->sizeBits != 0) {
      bVar5 = this->sizeBits;
    }
    digits._M_ptr = (pointer)(ulong)this->hasUnknown;
    local_40 = (this->digits).super_SmallVectorBase<slang::logic_t>.data_;
    sStack_38 = (this->digits).super_SmallVectorBase<slang::logic_t>.len;
    digits._M_extent._M_extent_value = in_R9._M_extent_value;
    SVInt::fromDigits((bitwidth_t)&local_90,(LiteralBase)bVar5,(bool)this->literalBase,
                      this->signFlag,digits);
    pBVar1 = this->alloc;
    sVar7 = Token::trivia(local_60);
    if (singleToken) {
      local_70 = Token::rawText(local_60);
    }
    else {
      iVar2 = SmallVectorBase<char>::copy
                        (&(this->text).super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,
                         (EVP_PKEY_CTX *)sVar7._M_extent._M_extent_value._M_extent_value);
      local_70._M_str._4_4_ = extraout_var_01;
      local_70._M_str._0_4_ = iVar2;
      local_70._M_len = extraout_RDX_01;
    }
    Token::Token((Token *)&local_80,pBVar1,IntegerLiteral,sVar7,local_70,this->firstLocation,
                 (SVInt *)&local_90);
  }
  uVar3 = CONCAT71(local_80.val._1_7_,local_80.val._0_1_);
  pIVar4 = (Info *)CONCAT26(uStack_72,CONCAT15(bStack_73,CONCAT14(uStack_74,local_78)));
  if (((0x40 < local_88) || ((bStack_83 & 1) != 0)) &&
     ((void *)CONCAT26(local_90.val._6_2_,local_90.val._0_6_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT26(local_90.val._6_2_,local_90.val._0_6_));
  }
LAB_00877a71:
  TVar6.info = pIVar4;
  TVar6.kind = (short)uVar3;
  TVar6._2_1_ = (char)((ulong)uVar3 >> 0x10);
  TVar6.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  TVar6.rawLen = (int)((ulong)uVar3 >> 0x20);
  return TVar6;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken, bool isNegated) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    auto checkOverflow = [&](bitwidth_t computedWidth, const SVInt& value) {
        // Special case to avoid the warning when we have a minus operator preceeding
        // a min value signed negative integer, with no unknowns.
        if (isNegated && signFlag && !hasUnknown && computedWidth == sizeBits + 1 &&
            value.isNegative() && value.countOnes() == 1) {
            return;
        }

        addDiag(diag::VectorLiteralOverflow, firstLocation) << computedWidth;
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal && !hasUnknown) {
        // If we added an x or z, we will fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        bitwidth_t width = decimalValue.getBitWidth();
        if (signFlag) {
            width++;
            decimalValue = decimalValue.resize(width);
        }

        // If no size was specified, just return the value as-is. Otherwise,
        // resize it to match the desired size. Warn if that will truncate.
        SVInt result;
        if (!sizeBits) {
            // Unsized numbers are required to be at least 32 bits by the spec.
            if (width < 32)
                result = decimalValue.resize(32);
            else
                result = std::move(decimalValue);
        }
        else if (width != sizeBits) {
            result = decimalValue.resize(sizeBits);
            if (width > sizeBits)
                checkOverflow(width, result);
        }
        else {
            result = std::move(decimalValue);
        }

        result.setSigned(signFlag);
        return createResult(std::move(result));
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += (bitwidth_t)std::bit_width(digits[0].value);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                auto result = SVInt::fromDigits(sizeBits, literalBase, signFlag, hasUnknown,
                                                digits);
                checkOverflow(bits, result);
                return createResult(std::move(result));
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}